

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  function<void_(const_char_*)> *pfVar1;
  function<void_()> *pfVar2;
  uint uVar3;
  __node_base_ptr p_Var4;
  _func_int ***ppp_Var5;
  pointer puVar6;
  _Manager_type p_Var7;
  __buckets_ptr pp_Var8;
  size_type sVar9;
  __node_base_ptr *pp_Var10;
  bool bVar11;
  int iVar12;
  DatabaseInterface *this;
  DatabaseInterface *pDVar13;
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> _Var14;
  ulong uVar15;
  const_iterator cVar16;
  __node_base_ptr *pp_Var17;
  __node_base _Var18;
  iterator __end3;
  _Hash_node_base *p_Var19;
  DatabaseInterface *pDVar20;
  long lVar21;
  iterator __begin3;
  pointer __k;
  bool should_filter_application_hash;
  bool invert_module_pruning;
  bool skip_application_info_links;
  size_t compressed_size;
  size_t hash_count;
  Hash latest_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  uint timestamp_seconds;
  Hash application_hash;
  unsigned_long hash;
  CLICallbacks cbs;
  uint64_t ts;
  StateReplayer replayer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  size_t state_json_size;
  string blacklist;
  string whitelist;
  string timestamp;
  string output_db_path;
  string input_db_path;
  uint per_tag_written [10];
  uint per_tag_read [10];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_graphics;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_graphics;
  CLIParser parser;
  int local_c78;
  char local_c71;
  DatabaseInterface *local_c70;
  DatabaseInterface *local_c68;
  char local_c5a;
  undefined1 local_c59;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c58;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_c40;
  long local_c38;
  _Hash_node_base local_c30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c28;
  uint local_c04;
  __node_base_ptr local_c00;
  __node_base_ptr local_bf8;
  CLICallbacks local_bf0;
  uint64_t local_b78;
  StateReplayer local_b70;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_b68;
  size_type local_b30;
  char *local_b28;
  long local_b20;
  char local_b18;
  undefined7 uStack_b17;
  char *local_b08;
  long local_b00;
  char local_af8;
  undefined7 uStack_af7;
  char *local_ae8;
  long local_ae0;
  char local_ad8;
  undefined7 uStack_ad7;
  char *local_ac8;
  long local_ac0;
  char local_ab8;
  undefined7 uStack_ab7;
  char *local_aa8;
  long local_aa0;
  char local_a98;
  undefined7 uStack_a97;
  int local_a88 [12];
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a30;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_9f8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_9c0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_988;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_950;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_918;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_8e0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_8a8;
  CLICallbacks local_870;
  CLIParser local_7f8;
  undefined1 local_768 [16];
  _Manager_type local_758;
  __node_base local_750;
  ResourceTag local_748;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_728;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_6f0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_6b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_680;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_648;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_610;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_5d8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_5a0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_568;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_530;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_4f8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_4c0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_488;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_450;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_418 [15];
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_d0 [2];
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> local_60;
  uint64_t local_58;
  __node_base_ptr local_50;
  bool local_48;
  undefined2 local_38;
  bool local_36;
  
  local_bf0.callbacks._M_h._M_buckets = &local_bf0.callbacks._M_h._M_single_bucket;
  local_bf0.callbacks._M_h._M_bucket_count = 1;
  local_bf0.callbacks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_bf0.callbacks._M_h._M_element_count = 0;
  local_bf0.callbacks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_bf0.callbacks._M_h._M_rehash_policy._M_next_resize = 0;
  local_bf0.callbacks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_bf0.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_bf0.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_bf0.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_bf0.error_handler._M_invoker = (_Invoker_type)0x0;
  local_bf0.default_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_bf0.default_handler.super__Function_base._M_functor._8_8_ = 0;
  local_bf0.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_bf0.default_handler._M_invoker = (_Invoker_type)0x0;
  local_aa8 = &local_a98;
  local_aa0 = 0;
  local_a98 = '\0';
  local_ac8 = &local_ab8;
  local_ac0 = 0;
  local_ab8 = '\0';
  local_b08 = &local_af8;
  local_b00 = 0;
  local_af8 = '\0';
  local_b28 = &local_b18;
  local_b20 = 0;
  local_b18 = '\0';
  local_ae8 = &local_ad8;
  local_ae0 = 0;
  local_ad8 = '\0';
  local_c04 = 0;
  local_c00 = (__node_base_ptr)0x0;
  local_c71 = '\0';
  local_c59 = 0;
  local_c5a = '\0';
  local_8a8._M_buckets = &local_8a8._M_single_bucket;
  local_8a8._M_bucket_count = 1;
  local_8a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_8a8._M_element_count = 0;
  local_8a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_8a8._M_rehash_policy._M_next_resize = 0;
  local_8a8._M_single_bucket = (__node_base_ptr)0x0;
  local_8e0._M_buckets = &local_8e0._M_single_bucket;
  local_8e0._M_bucket_count = 1;
  local_8e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_8e0._M_element_count = 0;
  local_8e0._M_rehash_policy._M_max_load_factor = 1.0;
  local_8e0._M_rehash_policy._M_next_resize = 0;
  local_8e0._M_single_bucket = (__node_base_ptr)0x0;
  local_918._M_buckets = &local_918._M_single_bucket;
  local_918._M_bucket_count = 1;
  local_918._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_918._M_element_count = 0;
  local_918._M_rehash_policy._M_max_load_factor = 1.0;
  local_918._M_rehash_policy._M_next_resize = 0;
  local_918._M_single_bucket = (__node_base_ptr)0x0;
  local_950._M_buckets = &local_950._M_single_bucket;
  local_950._M_bucket_count = 1;
  local_950._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_950._M_element_count = 0;
  local_950._M_rehash_policy._M_max_load_factor = 1.0;
  local_950._M_rehash_policy._M_next_resize = 0;
  local_950._M_single_bucket = (__node_base_ptr)0x0;
  local_988._M_buckets = &local_988._M_single_bucket;
  local_988._M_bucket_count = 1;
  local_988._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_988._M_element_count = 0;
  local_988._M_rehash_policy._M_max_load_factor = 1.0;
  local_988._M_rehash_policy._M_next_resize = 0;
  local_988._M_single_bucket = (__node_base_ptr)0x0;
  local_9c0._M_buckets = &local_9c0._M_single_bucket;
  local_9c0._M_bucket_count = 1;
  local_9c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_9c0._M_element_count = 0;
  local_9c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_9c0._M_rehash_policy._M_next_resize = 0;
  local_9c0._M_single_bucket = (__node_base_ptr)0x0;
  local_9f8._M_buckets = &local_9f8._M_single_bucket;
  local_9f8._M_bucket_count = 1;
  local_9f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_9f8._M_element_count = 0;
  local_9f8._M_rehash_policy._M_max_load_factor = 1.0;
  local_9f8._M_rehash_policy._M_next_resize = 0;
  local_9f8._M_single_bucket = (__node_base_ptr)0x0;
  local_a30._M_buckets = &local_a30._M_single_bucket;
  local_a30._M_bucket_count = 1;
  local_a30._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a30._M_element_count = 0;
  local_a30._M_rehash_policy._M_max_load_factor = 1.0;
  local_a30._M_rehash_policy._M_next_resize = 0;
  local_a30._M_single_bucket = (__node_base_ptr)0x0;
  local_768._0_8_ = (void *)0x0;
  local_768._8_8_ = 0;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:578:20)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:578:20)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--help",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_aa8;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:579:24)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:579:24)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--input-db",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_ac8;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:580:25)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:580:25)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--output-db",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._0_8_ = &local_c00;
  local_768._8_8_ = &local_c71;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:581:34)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:581:34)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--filter-application",(function<void_(Fossilize::CLIParser_&)> *)local_768)
  ;
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_8a8;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:585:31)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:585:31)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--filter-graphics",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_8e0;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:588:30)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:588:30)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--filter-compute",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_918;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:591:33)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:591:33)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--filter-raytracing",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_950;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:594:29)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:594:29)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--filter-module",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._0_8_ = &local_ae8;
  local_768._8_8_ = &local_c04;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:597:32)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:597:32)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--filter-timestamp",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_988;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:601:29)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:601:29)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--skip-graphics",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_9c0;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:604:28)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:604:28)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--skip-compute",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_9f8;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:607:31)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:607:31)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--skip-raytracing",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_a30;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:610:27)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:610:27)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--skip-module",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_c59;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:613:43)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:613:43)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--skip-application-info-links",
             (function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_c5a;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:616:37)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:616:37)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--invert-module-pruning",
             (function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_b08;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:619:25)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:619:25)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--whitelist",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_b28;
  local_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:622:25)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:622:25)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_bf0,"--blacklist",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  p_Var7 = local_bf0.error_handler.super__Function_base._M_manager;
  local_768._0_8_ = local_bf0.error_handler.super__Function_base._M_functor._M_unused._M_object;
  local_768._8_8_ = local_bf0.error_handler.super__Function_base._M_functor._8_8_;
  local_bf0.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_bf0.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_758 = local_bf0.error_handler.super__Function_base._M_manager;
  local_bf0.error_handler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:625:22)>
       ::_M_manager;
  local_750._M_nxt = (_Hash_node_base *)local_bf0.error_handler._M_invoker;
  local_bf0.error_handler._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:625:22)>
       ::_M_invoke;
  if (p_Var7 != (_Manager_type)0x0) {
    (*p_Var7)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&local_870,&local_bf0,&local_bf0);
  local_870.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_870.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_870.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_870.error_handler._M_invoker = local_bf0.error_handler._M_invoker;
  if (local_bf0.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_870.error_handler.super__Function_base._M_functor._M_unused._M_object =
         local_bf0.error_handler.super__Function_base._M_functor._M_unused._M_object;
    local_870.error_handler.super__Function_base._M_functor._8_8_ =
         local_bf0.error_handler.super__Function_base._M_functor._8_8_;
    local_870.error_handler.super__Function_base._M_manager =
         local_bf0.error_handler.super__Function_base._M_manager;
    local_bf0.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
    local_bf0.error_handler._M_invoker = (_Invoker_type)0x0;
  }
  local_870.default_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_870.default_handler.super__Function_base._M_functor._8_8_ = 0;
  local_870.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_870.default_handler._M_invoker = local_bf0.default_handler._M_invoker;
  if (local_bf0.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_870.default_handler.super__Function_base._M_functor._M_unused._M_object =
         local_bf0.default_handler.super__Function_base._M_functor._M_unused._M_object;
    local_870.default_handler.super__Function_base._M_functor._8_8_ =
         local_bf0.default_handler.super__Function_base._M_functor._8_8_;
    local_870.default_handler.super__Function_base._M_manager =
         local_bf0.default_handler.super__Function_base._M_manager;
    local_bf0.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
    local_bf0.default_handler._M_invoker = (_Invoker_type)0x0;
  }
  Fossilize::CLIParser::CLIParser(&local_7f8,&local_870,argc + -1,argv + 1);
  if (local_870.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_870.default_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_870.default_handler,(_Any_data *)&local_870.default_handler,
               __destroy_functor);
  }
  if (local_870.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_870.error_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_870.error_handler,(_Any_data *)&local_870.error_handler,
               __destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_870);
  bVar11 = Fossilize::CLIParser::parse(&local_7f8);
  local_c78 = 1;
  if ((!bVar11) || (local_c78 = 0, local_7f8.ended_state != false)) goto LAB_00110b30;
  if ((local_aa0 == 0) || (local_ac0 == 0)) {
    main_cold_21();
    local_c78 = 1;
    goto LAB_00110b30;
  }
  local_c78 = 1;
  this = Fossilize::create_database(local_aa8,ReadOnly);
  pDVar13 = Fossilize::create_database(local_ac8,OverWrite);
  if (this == (DatabaseInterface *)0x0) {
LAB_00111584:
    main_cold_20();
  }
  else {
    if ((local_b00 == 0) ||
       (bVar11 = Fossilize::DatabaseInterface::load_whitelist_database(this,local_b08), bVar11)) {
      if ((local_b20 == 0) ||
         (bVar11 = Fossilize::DatabaseInterface::load_blacklist_database(this,local_b28), bVar11)) {
        iVar12 = (*this->_vptr_DatabaseInterface[2])(this);
        if ((char)iVar12 == '\0') goto LAB_00111584;
        if ((pDVar13 == (DatabaseInterface *)0x0) ||
           (iVar12 = (*pDVar13->_vptr_DatabaseInterface[2])(pDVar13), (char)iVar12 == '\0')) {
          main_cold_19();
          goto LAB_001115b4;
        }
        local_c68 = pDVar13;
        Fossilize::StateReplayer::StateReplayer(&local_b70);
        PruneReplayer::PruneReplayer((PruneReplayer *)local_768);
        Fossilize::StateReplayer::set_resolve_shader_module_handles(&local_b70,false);
        if (local_c71 == '\x01') {
          local_48 = true;
          local_50 = local_c00;
        }
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_5a0,&local_8a8);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_568,&local_8e0);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_530,&local_918);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_4f8,&local_950);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_4c0,&local_988);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_488,&local_9c0);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_450,&local_9f8);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(local_418,&local_a30);
        local_36 = (bool)local_c59;
        if (local_ae0 == 0) {
LAB_00110f30:
          local_a48 = 0;
          uStack_a40 = 0;
          local_a58 = 0;
          uStack_a50 = 0;
          local_a38 = 0;
          local_a88[8] = 0;
          local_a88[9] = 0;
          local_a88[4] = 0;
          local_a88[5] = 0;
          local_a88[6] = 0;
          local_a88[7] = 0;
          local_a88[0] = 0;
          local_a88[1] = 0;
          local_a88[2] = 0;
          local_a88[3] = 0;
          local_c28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_c28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c78 = 0;
          lVar21 = 0;
          pDVar13 = local_c68;
          do {
            local_c40 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)0x0;
            uVar3 = *(uint *)((long)main::playback_order + lVar21);
            pDVar20 = (DatabaseInterface *)(ulong)uVar3;
            local_c38 = lVar21;
            iVar12 = (*this->_vptr_DatabaseInterface[6])(this,pDVar20,&local_c40,0);
            if ((char)iVar12 == '\0') {
              main_cold_4();
              local_c78 = 1;
              goto LAB_001118c3;
            }
            *(int *)((long)&local_a58 + (long)pDVar20 * 4) = (int)local_c40;
            lVar21 = local_c38;
            if (pDVar20 != (DatabaseInterface *)0x4) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b68,
                         (size_type)local_c40,(allocator_type *)&local_c58);
              iVar12 = (*this->_vptr_DatabaseInterface[6])(this,(ulong)uVar3,&local_c40);
              sVar9 = local_b68._M_bucket_count;
              if ((char)iVar12 == '\0') {
                main_cold_5();
                local_c78 = 1;
                bVar11 = false;
              }
              else {
                p_Var19 = (_Hash_node_base *)local_b68._M_bucket_count;
                pp_Var17 = local_b68._M_buckets;
                local_c70 = pDVar20;
                pp_Var10 = local_b68._M_buckets;
                _Var18._M_nxt = local_b68._M_before_begin._M_nxt;
                if ((pDVar20 == (DatabaseInterface *)0x0) &&
                   ((_Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                     )local_60._M_head_impl != (DatabaseInterface *)0x0)) {
                  local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_c30._M_nxt = (__node_base_ptr)0x0;
                  if (local_b68._M_buckets == (__buckets_ptr)local_b68._M_bucket_count) {
LAB_0011111d:
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_c58,
                               (iterator)
                               local_c58.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_c30
                              );
                    pp_Var17 = (__node_base_ptr *)
                               local_c58.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                    _Var18._M_nxt =
                         (_Hash_node_base *)
                         local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    p_Var19 = (_Hash_node_base *)
                              local_c58.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    uVar15 = 0;
                    do {
                      local_bf8 = *pp_Var17;
                      local_b78 = 0;
                      if ((local_bf8 == local_c00) ||
                         (bVar11 = PruneReplayer::filter_timestamp
                                             ((PruneReplayer *)local_768,RESOURCE_APPLICATION_INFO,
                                              (Hash)local_bf8,&local_b78), bVar11)) {
                        if (local_c58.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish ==
                            local_c58.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_long,std::allocator<unsigned_long>>::
                          _M_realloc_insert<unsigned_long_const&>
                                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                                     &local_c58,
                                     (iterator)
                                     local_c58.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                                     (unsigned_long *)&local_bf8);
                        }
                        else {
                          *local_c58.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish = (unsigned_long)local_bf8;
                          local_c58.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_c58.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                      }
                      if (uVar15 < local_b78) {
                        local_c30._M_nxt = local_bf8;
                        uVar15 = local_b78;
                      }
                      pp_Var17 = pp_Var17 + 1;
                    } while (pp_Var17 != (__node_base_ptr *)sVar9);
                    pp_Var17 = (__node_base_ptr *)
                               local_c58.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                    _Var18._M_nxt =
                         (_Hash_node_base *)
                         local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    p_Var19 = (_Hash_node_base *)
                              local_c58.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                    if (local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start ==
                        local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
                      if (local_c58.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_c58.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) goto LAB_0011111d;
                      *(_Hash_node_base **)
                       local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish = local_c30._M_nxt;
                      p_Var19 = (_Hash_node_base *)
                                (local_c58.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 1);
                    }
                  }
                  pp_Var8 = local_b68._M_buckets;
                  local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
                  local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
                  local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  pp_Var10 = pp_Var17;
                  local_b68._M_bucket_count = (size_type)p_Var19;
                  if ((local_b68._M_buckets != (__node_base_ptr *)0x0) &&
                     (uVar15 = (long)local_b68._M_before_begin._M_nxt - (long)local_b68._M_buckets,
                     local_b68._M_buckets = pp_Var17,
                     local_b68._M_before_begin._M_nxt = _Var18._M_nxt,
                     operator_delete(pp_Var8,uVar15),
                     p_Var19 = (_Hash_node_base *)local_b68._M_bucket_count,
                     pp_Var17 = local_b68._M_buckets, pp_Var10 = local_b68._M_buckets,
                     _Var18._M_nxt = local_b68._M_before_begin._M_nxt,
                     local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start != (key_type *)0x0)) {
                    operator_delete(local_c58.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_c58.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_c58.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                    p_Var19 = (_Hash_node_base *)local_b68._M_bucket_count;
                    pp_Var17 = local_b68._M_buckets;
                    pp_Var10 = local_b68._M_buckets;
                    _Var18._M_nxt = local_b68._M_before_begin._M_nxt;
                  }
                }
                for (; local_b68._M_before_begin._M_nxt = _Var18._M_nxt,
                    local_b68._M_buckets = pp_Var10, pDVar13 = local_c70,
                    (_Hash_node_base *)pp_Var17 != p_Var19; pp_Var17 = pp_Var17 + 1) {
                  p_Var4 = *pp_Var17;
                  iVar12 = (*this->_vptr_DatabaseInterface[3])(this,local_c70,p_Var4,&local_b30,0,0)
                  ;
                  if ((char)iVar12 == '\0') {
LAB_001113a4:
                    main_cold_6();
                    local_c78 = 1;
                    bVar11 = false;
                    goto LAB_001113c6;
                  }
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_c28,local_b30);
                  iVar12 = (*this->_vptr_DatabaseInterface[3])
                                     (this,(ulong)pDVar13 & 0xffffffff,p_Var4);
                  if ((char)iVar12 == '\0') goto LAB_001113a4;
                  local_38._0_1_ = false;
                  local_38._1_1_ = false;
                  bVar11 = Fossilize::StateReplayer::parse
                                     (&local_b70,(StateCreatorInterface *)local_768,this,
                                      local_c28.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_c28.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_c28.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                  if (!bVar11) {
                    fprintf(_stderr,
                            "Fossilize ERROR: Failed to parse blob (tag: %d, hash: 0x%lx).\n",
                            local_c70);
                  }
                  if ((local_c70 == (DatabaseInterface *)0x0) &&
                     ((local_c71 != '\x01' || (p_Var4 == local_c00)))) {
                    local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
                    iVar12 = (*this->_vptr_DatabaseInterface[3])(this,0,p_Var4);
                    if ((char)iVar12 != '\0') {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_c28,
                                 (size_type)
                                 local_c58.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
                      iVar12 = (*this->_vptr_DatabaseInterface[3])(this,0,p_Var4);
                      if (((char)iVar12 != '\0') &&
                         (iVar12 = (*local_c68->_vptr_DatabaseInterface[4])(local_c68,0,p_Var4),
                         (char)iVar12 != '\0')) {
                        local_a88[(long)local_c70] = local_a88[(long)local_c70] + 1;
                        goto LAB_00111313;
                      }
                    }
                    local_c78 = 1;
                    bVar11 = false;
                    goto LAB_001113c6;
                  }
LAB_00111313:
                  pp_Var10 = local_b68._M_buckets;
                  _Var18._M_nxt = local_b68._M_before_begin._M_nxt;
                }
                bVar11 = true;
                if (local_c70 == (DatabaseInterface *)0x9) {
                  PruneReplayer::access_raytracing_pipelines((PruneReplayer *)local_768);
                }
                else if ((int)local_c70 == 6) {
                  PruneReplayer::access_graphics_pipelines((PruneReplayer *)local_768);
                }
              }
LAB_001113c6:
              lVar21 = local_c38;
              if (local_b68._M_buckets != (__node_base_ptr *)0x0) {
                operator_delete(local_b68._M_buckets,
                                (long)local_b68._M_before_begin._M_nxt - (long)local_b68._M_buckets)
                ;
              }
              pDVar13 = local_c68;
              if (!bVar11) goto LAB_001118c3;
            }
            lVar21 = lVar21 + 4;
          } while (lVar21 != 0x24);
          local_c70 = this;
          if (local_c5a == '\x01') {
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(local_d0);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)(local_768 + 8));
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_728);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_680);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_6f0);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_648);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_610);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_5d8);
            local_c30._M_nxt = (__node_base_ptr)0x0;
            iVar12 = (*local_c70->_vptr_DatabaseInterface[6])(local_c70,4,&local_c30,0);
            if ((char)iVar12 == '\0') {
              main_cold_7();
              goto LAB_001118a9;
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_c58,(size_type)local_c30._M_nxt,(allocator_type *)&local_b68);
            iVar12 = (*local_c70->_vptr_DatabaseInterface[6])
                               (local_c70,4,&local_c30,
                                local_c58.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
            puVar6 = local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((char)iVar12 == '\0') {
              main_cold_8();
              local_c78 = 1;
            }
            else {
              local_b68._M_buckets = &local_b68._M_single_bucket;
              local_b68._M_bucket_count = 1;
              local_b68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_b68._M_element_count = 0;
              local_b68._M_rehash_policy._M_max_load_factor = 1.0;
              local_b68._M_rehash_policy._M_next_resize = 0;
              local_b68._M_single_bucket = (__node_base_ptr)0x0;
              if (local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                __k = local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
                do {
                  cVar16 = std::
                           _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find(&local_6b8,__k);
                  if (cVar16.super__Node_iterator_base<unsigned_long,_false>._M_cur ==
                      (__node_type *)0x0) {
                    local_c40 = &local_b68;
                    std::
                    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)&local_b68,__k,&local_c40);
                  }
                  __k = __k + 1;
                } while (__k != puVar6);
              }
              std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_move_assign(&local_6b8,&local_b68);
              std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable(&local_b68);
            }
            if (local_c58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (key_type *)0x0) {
              operator_delete(local_c58.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_c58.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c58.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            pDVar13 = local_c68;
            this = local_c70;
            if ((char)iVar12 != '\0') goto LAB_00111602;
          }
          else {
LAB_00111602:
            bVar11 = copy_accessed_types(local_c70,local_c68,&local_c28,
                                         (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                          *)local_d0[0]._M_before_begin._M_nxt,
                                         (ResourceTag)local_d0[0]._M_element_count,(uint *)0x8);
            if (bVar11) {
              bVar11 = copy_accessed_types(local_c70,local_c68,&local_c28,
                                           (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                            *)local_750._M_nxt,local_748,(uint *)0x1);
              if (bVar11) {
                bVar11 = copy_accessed_types(local_c70,local_c68,&local_c28,
                                             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                              *)local_728._M_before_begin._M_nxt,
                                             (ResourceTag)local_728._M_element_count,(uint *)0x2);
                if (bVar11) {
                  bVar11 = copy_accessed_types(local_c70,local_c68,&local_c28,
                                               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                *)local_6b8._M_before_begin._M_nxt,
                                               (ResourceTag)local_6b8._M_element_count,(uint *)0x4);
                  if (bVar11) {
                    bVar11 = copy_accessed_types(local_c70,local_c68,&local_c28,
                                                 (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)local_680._M_before_begin._M_nxt,
                                                 (ResourceTag)local_680._M_element_count,(uint *)0x5
                                                );
                    if (bVar11) {
                      bVar11 = copy_accessed_types(local_c70,local_c68,&local_c28,
                                                   (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)local_6f0._M_before_begin._M_nxt,
                                                  (ResourceTag)local_6f0._M_element_count,
                                                  (uint *)0x3);
                      if (bVar11) {
                        bVar11 = copy_accessed_types(local_c70,local_c68,&local_c28,
                                                     (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)local_648._M_before_begin._M_nxt,
                                                  (ResourceTag)local_648._M_element_count,
                                                  (uint *)0x6);
                        if (bVar11) {
                          bVar11 = copy_accessed_types(local_c70,local_c68,&local_c28,
                                                       (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)local_610._M_before_begin._M_nxt,
                                                  (ResourceTag)local_610._M_element_count,
                                                  (uint *)0x7);
                          if (bVar11) {
                            bVar11 = copy_accessed_types(local_c70,local_c68,&local_c28,
                                                         (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)local_5d8._M_before_begin._M_nxt,
                                                  (ResourceTag)local_5d8._M_element_count,
                                                  (uint *)0x9);
                            if (bVar11) {
                              main_cold_18();
                              pDVar13 = local_c68;
                              this = local_c70;
                              goto LAB_001118c3;
                            }
                            main_cold_17();
                          }
                          else {
                            main_cold_16();
                          }
                        }
                        else {
                          main_cold_15();
                        }
                      }
                      else {
                        main_cold_14();
                      }
                    }
                    else {
                      main_cold_13();
                    }
                  }
                  else {
                    main_cold_12();
                  }
                }
                else {
                  main_cold_11();
                }
              }
              else {
                main_cold_10();
              }
            }
            else {
              main_cold_9();
            }
LAB_001118a9:
            local_c78 = 1;
            pDVar13 = local_c68;
            this = local_c70;
          }
LAB_001118c3:
          if (local_c28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c28.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_c28.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_c28.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          _Var14._M_head_impl = Fossilize::create_stream_archive_database(local_ae8,ReadOnly);
          if (local_60._M_head_impl != (DatabaseInterface *)0x0) {
            ppp_Var5 = &(local_60._M_head_impl)->_vptr_DatabaseInterface;
            local_60._M_head_impl = _Var14._M_head_impl;
            (*(*ppp_Var5)[1])();
            _Var14._M_head_impl = local_60._M_head_impl;
          }
          local_60._M_head_impl = _Var14._M_head_impl;
          iVar12 = (*(local_60._M_head_impl)->_vptr_DatabaseInterface[2])();
          if ((char)iVar12 != '\0') {
            uVar15 = time((time_t *)0x0);
            local_58 = uVar15 - local_c04;
            if (uVar15 < local_c04) {
              local_58 = 0;
            }
            goto LAB_00110f30;
          }
          main_cold_3();
          local_c78 = 1;
          pDVar13 = local_c68;
        }
        PruneReplayer::~PruneReplayer((PruneReplayer *)local_768);
        Fossilize::StateReplayer::~StateReplayer(&local_b70);
        goto LAB_001115bc;
      }
      main_cold_2();
    }
    else {
      main_cold_1();
    }
LAB_001115b4:
    local_c78 = 1;
  }
LAB_001115bc:
  if (pDVar13 != (DatabaseInterface *)0x0) {
    (*pDVar13->_vptr_DatabaseInterface[1])(pDVar13);
  }
  if (this != (DatabaseInterface *)0x0) {
    (*this->_vptr_DatabaseInterface[1])(this);
  }
LAB_00110b30:
  if (local_7f8.cbs.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_7f8.cbs.default_handler;
    (*local_7f8.cbs.default_handler.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if (local_7f8.cbs.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar2 = &local_7f8.cbs.error_handler;
    (*local_7f8.cbs.error_handler.super__Function_base._M_manager)
              ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_7f8);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a30);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_9f8);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_9c0);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_988);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_950);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_918);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_8e0);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_8a8);
  if (local_ae8 != &local_ad8) {
    operator_delete(local_ae8,CONCAT71(uStack_ad7,local_ad8) + 1);
  }
  if (local_b28 != &local_b18) {
    operator_delete(local_b28,CONCAT71(uStack_b17,local_b18) + 1);
  }
  if (local_b08 != &local_af8) {
    operator_delete(local_b08,CONCAT71(uStack_af7,local_af8) + 1);
  }
  if (local_ac8 != &local_ab8) {
    operator_delete(local_ac8,CONCAT71(uStack_ab7,local_ab8) + 1);
  }
  if (local_aa8 != &local_a98) {
    operator_delete(local_aa8,CONCAT71(uStack_a97,local_a98) + 1);
  }
  if (local_bf0.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_bf0.default_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_bf0.default_handler,(_Any_data *)&local_bf0.default_handler,
               __destroy_functor);
  }
  if (local_bf0.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_bf0.error_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_bf0.error_handler,(_Any_data *)&local_bf0.error_handler,
               __destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_bf0);
  return local_c78;
}

Assistant:

int main(int argc, char *argv[])
{
	CLICallbacks cbs;
	string input_db_path;
	string output_db_path;
	string whitelist, blacklist, timestamp;
	unsigned timestamp_seconds = 0;
	Hash application_hash = 0;
	bool should_filter_application_hash = false;
	bool skip_application_info_links = false;
	bool invert_module_pruning = false;

	unordered_set<Hash> filter_graphics;
	unordered_set<Hash> filter_compute;
	unordered_set<Hash> filter_raytracing;
	unordered_set<Hash> filter_modules;

	unordered_set<Hash> banned_graphics;
	unordered_set<Hash> banned_compute;
	unordered_set<Hash> banned_raytracing;
	unordered_set<Hash> banned_modules;

	cbs.add("--help", [](CLIParser &parser) { print_help(); parser.end(); });
	cbs.add("--input-db", [&](CLIParser &parser) { input_db_path = parser.next_string(); });
	cbs.add("--output-db", [&](CLIParser &parser) { output_db_path = parser.next_string(); });
	cbs.add("--filter-application", [&](CLIParser &parser) {
		application_hash = strtoull(parser.next_string(), nullptr, 16);
		should_filter_application_hash = true;
	});
	cbs.add("--filter-graphics", [&](CLIParser &parser) {
		filter_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-compute", [&](CLIParser &parser) {
		filter_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-raytracing", [&](CLIParser &parser) {
		filter_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-module", [&](CLIParser &parser) {
		filter_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-timestamp", [&](CLIParser &parser) {
		timestamp = parser.next_string();
		timestamp_seconds = parser.next_uint();
	});
	cbs.add("--skip-graphics", [&](CLIParser &parser) {
		banned_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-compute", [&](CLIParser &parser) {
		banned_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-raytracing", [&](CLIParser &parser) {
		banned_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-module", [&](CLIParser &parser) {
		banned_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-application-info-links", [&](CLIParser &) {
		skip_application_info_links = true;
	});
	cbs.add("--invert-module-pruning", [&](CLIParser &) {
		invert_module_pruning = true;
	});
	cbs.add("--whitelist", [&](CLIParser &parser) {
		whitelist = parser.next_string();
	});
	cbs.add("--blacklist", [&](CLIParser &parser) {
		blacklist = parser.next_string();
	});
	cbs.error_handler = [] { print_help(); };

	CLIParser parser(std::move(cbs), argc - 1, argv + 1);
	if (!parser.parse())
		return EXIT_FAILURE;
	if (parser.is_ended_state())
		return EXIT_SUCCESS;

	if (input_db_path.empty() || output_db_path.empty())
	{
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(input_db_path.c_str(), DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(output_db_path.c_str(), DatabaseMode::OverWrite));

	if (input_db && !whitelist.empty())
	{
		if (!input_db->load_whitelist_database(whitelist.c_str()))
		{
			LOGE("Failed to install whitelist database %s.\n", whitelist.c_str());
			return EXIT_FAILURE;
		}
	}

	if (input_db && !blacklist.empty())
	{
		if (!input_db->load_blacklist_database(blacklist.c_str()))
		{
			LOGE("Failed to install blacklist database %s.\n", blacklist.c_str());
			return EXIT_FAILURE;
		}
	}

	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db || !output_db->prepare())
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	StateReplayer replayer;
	PruneReplayer prune_replayer;

	replayer.set_resolve_shader_module_handles(false);

	if (should_filter_application_hash)
	{
		prune_replayer.should_filter_application_hash = true;
		prune_replayer.filter_application_hash = application_hash;
	}

	prune_replayer.filter_graphics = std::move(filter_graphics);
	prune_replayer.filter_compute = std::move(filter_compute);
	prune_replayer.filter_raytracing = std::move(filter_raytracing);
	prune_replayer.filter_modules = std::move(filter_modules);
	prune_replayer.banned_graphics = std::move(banned_graphics);
	prune_replayer.banned_compute = std::move(banned_compute);
	prune_replayer.banned_raytracing = std::move(banned_raytracing);
	prune_replayer.banned_modules = std::move(banned_modules);
	prune_replayer.skip_application_info_links = skip_application_info_links;

	if (!timestamp.empty())
	{
		prune_replayer.timestamp_db.reset(create_stream_archive_database(timestamp.c_str(), DatabaseMode::ReadOnly));
		if (!prune_replayer.timestamp_db->prepare())
		{
			LOGE("Failed to open timestamp DB.\n");
			return EXIT_FAILURE;
		}
		prune_replayer.timestamp_minimum_accept = time(nullptr);
		prune_replayer.timestamp_minimum_accept -=
				std::min<uint64_t>(prune_replayer.timestamp_minimum_accept, timestamp_seconds);
	}

	static const ResourceTag playback_order[] = {
		RESOURCE_APPLICATION_INFO,
		RESOURCE_APPLICATION_BLOB_LINK,
		RESOURCE_SHADER_MODULE,
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Implicitly pulls in dependent samplers.
		RESOURCE_PIPELINE_LAYOUT,
		RESOURCE_RENDER_PASS,
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	unsigned per_tag_read[RESOURCE_COUNT] = {};
	unsigned per_tag_written[RESOURCE_COUNT] = {};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Application Blob Link",
		"Raytracing Pipeline",
	};

	vector<uint8_t> state_json;

	for (auto &tag : playback_order)
	{
		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		per_tag_read[tag] = hash_count;

		// No need to resolve this type.
		if (tag == RESOURCE_SHADER_MODULE)
			continue;

		vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		// Filter application infos as well,
		// but avoid a situation where we omit all application infos since these are very important in replay.
		if (tag == RESOURCE_APPLICATION_INFO && prune_replayer.timestamp_db)
		{
			vector<Hash> accepted_hashes;
			uint64_t latest_ts = 0;
			Hash latest_hash = 0;

			for (auto hash : hashes)
			{
				uint64_t ts = 0;
				if (hash == application_hash || prune_replayer.filter_timestamp(RESOURCE_APPLICATION_INFO, hash, &ts))
					accepted_hashes.push_back(hash);

				if (ts > latest_ts)
				{
					latest_hash = hash;
					latest_ts = ts;
				}
			}

			if (accepted_hashes.empty())
				accepted_hashes.push_back(latest_hash);

			hashes = std::move(accepted_hashes);
		}

		for (auto hash : hashes)
		{
			size_t state_json_size;
			if (!input_db->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);

			if (!input_db->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			prune_replayer.has_application_info_for_blob = false;
			prune_replayer.blob_belongs_to_application_info = false;
			if (!replayer.parse(prune_replayer, input_db.get(), state_json.data(), state_json.size()))
				LOGE("Failed to parse blob (tag: %d, hash: 0x%" PRIx64 ").\n", tag, hash);

			if (tag == RESOURCE_APPLICATION_INFO)
			{
				if (!should_filter_application_hash || hash == application_hash)
				{
					size_t compressed_size = 0;
					if (!input_db->read_entry(tag, hash, &compressed_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					state_json.resize(compressed_size);
					if (!input_db->read_entry(tag, hash, &compressed_size, state_json.data(),
					                          PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					if (!output_db->write_entry(tag, hash, state_json.data(), state_json.size(),
					                            PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					per_tag_written[tag]++;
				}
			}
		}

		if (tag == RESOURCE_GRAPHICS_PIPELINE)
			prune_replayer.access_graphics_pipelines();
		else if (tag == RESOURCE_RAYTRACING_PIPELINE)
			prune_replayer.access_raytracing_pipelines();
	}

	if (invert_module_pruning)
	{
		// In this mode we're only interesting in emitting the shader modules we did not emit for whatever reason.
		// A handy debug option in some scenarios.
		prune_replayer.filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK].clear();
		prune_replayer.accessed_samplers.clear();
		prune_replayer.accessed_descriptor_sets.clear();
		prune_replayer.accessed_render_passes.clear();
		prune_replayer.accessed_pipeline_layouts.clear();
		prune_replayer.accessed_graphics_pipelines.clear();
		prune_replayer.accessed_compute_pipelines.clear();
		prune_replayer.accessed_raytracing_pipelines.clear();

		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(RESOURCE_SHADER_MODULE, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(RESOURCE_SHADER_MODULE, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		unordered_set<Hash> unreferenced_modules;
		for (auto &h : hashes)
			if (prune_replayer.accessed_shader_modules.count(h) == 0)
				unreferenced_modules.insert(h);
		prune_replayer.accessed_shader_modules = std::move(unreferenced_modules);
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK],
	                         RESOURCE_APPLICATION_BLOB_LINK,
	                         per_tag_written))
	{
		LOGE("Failed to copy APPLICATION_BLOCK_LINK.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_samplers, RESOURCE_SAMPLER,
	                         per_tag_written))
	{
		LOGE("Failed to copy RESOURCE_SAMPLERs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_descriptor_sets, RESOURCE_DESCRIPTOR_SET_LAYOUT,
	                         per_tag_written))
	{
		LOGE("Failed to copy DESCRIPTOR_SET_LAYOUTs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_shader_modules, RESOURCE_SHADER_MODULE,
	                         per_tag_written))
	{
		LOGE("Failed to copy SHADER_MODULEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_render_passes, RESOURCE_RENDER_PASS,
	                         per_tag_written))
	{
		LOGE("Failed to copy RENDER_PASSes.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_pipeline_layouts, RESOURCE_PIPELINE_LAYOUT,
	                         per_tag_written))
	{
		LOGE("Failed to copy PIPELINE_LAYOUTs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_graphics_pipelines, RESOURCE_GRAPHICS_PIPELINE,
	                         per_tag_written))
	{
		LOGE("Failed to copy GRAPHICS_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_compute_pipelines, RESOURCE_COMPUTE_PIPELINE,
	                         per_tag_written))
	{
		LOGE("Failed to copy COMPUTE_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
							 prune_replayer.accessed_raytracing_pipelines, RESOURCE_RAYTRACING_PIPELINE,
							 per_tag_written))
	{
		LOGE("Failed to copy RAYTRACING_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	for (auto tag : playback_order)
		LOGI("Pruned %s entries: %u -> %u entries\n", tag_names[tag], per_tag_read[tag], per_tag_written[tag]);
}